

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O2

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  long lVar3;
  DecodeStatus DVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint8_t *puVar7;
  MCInst *MI;
  uint16_t uVar8;
  uint8_t *puVar9;
  uint uVar10;
  uint uVar11;
  uint local_50;
  uint local_4c;
  DecodeStatus local_48;
  uint local_44;
  MCInst *local_40;
  uint16_t *local_38;
  
  uVar8 = 0;
  DVar4 = MCDisassembler_Fail;
  if (3 < code_len) {
    if (instr->csh->mode < CS_MODE_ARM) {
      uVar10 = *(uint *)code;
      local_4c = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
      ;
    }
    else {
      local_4c = *(uint *)code;
    }
    __s = instr->flat_insn->detail;
    local_40 = instr;
    local_38 = size;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
    }
    local_44 = ~local_4c;
    uVar10 = 0;
    local_48 = MCDisassembler_Success;
    puVar7 = DecoderTable32;
LAB_001898a3:
    puVar9 = puVar7;
    MI = local_40;
    switch(*puVar9) {
    case '\x01':
      bVar1 = puVar9[2];
      local_50 = (uint)bVar1;
      uVar10 = ~(-1 << (bVar1 & 0x1f)) << (puVar9[1] & 0x1f);
      if (bVar1 == 0x20) {
        uVar10 = 0xffffffff;
      }
      uVar10 = (uVar10 & local_4c) >> (puVar9[1] & 0x1f);
      puVar7 = puVar9 + 3;
      goto LAB_001898a3;
    case '\x02':
      uVar5 = decodeULEB128(puVar9 + 1,&local_50);
      puVar7 = puVar9 + (ulong)local_50 + 3;
      if (uVar10 == (uint)uVar5) goto LAB_001898a3;
      lVar3 = (ulong)local_50 + 1;
      break;
    case '\x03':
      bVar1 = puVar9[1];
      bVar2 = puVar9[2];
      local_50 = (uint)bVar2;
      uVar11 = ~(-1 << (bVar2 & 0x1f)) << (bVar1 & 0x1f);
      if (bVar2 == 0x20) {
        uVar11 = 0xffffffff;
      }
      uVar11 = uVar11 & local_4c;
      uVar5 = decodeULEB128(puVar9 + 3,&local_50);
      puVar7 = puVar9 + (ulong)local_50 + 5;
      if (uVar11 >> (bVar1 & 0x1f) == (uint)uVar5) goto LAB_001898a3;
      lVar3 = (ulong)local_50 + 3;
      break;
    case '\x04':
      decodeULEB128(puVar9 + 1,&local_50);
      puVar7 = puVar9 + (ulong)local_50 + 3;
      goto LAB_001898a3;
    case '\x05':
      goto switchD_001898bb_caseD_5;
    case '\x06':
      goto switchD_001898bb_caseD_6;
    default:
      goto switchD_001898bb_default;
    }
    puVar7 = puVar7 + *(ushort *)(puVar9 + lVar3);
    goto LAB_001898a3;
  }
LAB_00189a59:
  *size = uVar8;
  return DVar4 == MCDisassembler_Success;
switchD_001898bb_caseD_6:
  uVar5 = decodeULEB128(puVar9 + 1,&local_50);
  puVar9 = puVar9 + (ulong)local_50 + 1;
  uVar6 = decodeULEB128(puVar9,&local_50);
  puVar7 = puVar9 + local_50;
  if (((uint)uVar6 & local_44) != 0 || ((uint)uVar5 & local_4c) != 0) {
    local_48 = MCDisassembler_SoftFail;
  }
  goto LAB_001898a3;
switchD_001898bb_caseD_5:
  uVar5 = decodeULEB128(puVar9 + 1,&local_50);
  uVar6 = decodeULEB128(puVar9 + (ulong)local_50 + 1,&local_50);
  MI = local_40;
  MCInst_setOpcode(local_40,(uint)uVar5);
  DVar4 = decodeToMCInst_4(local_48,(uint)uVar6,local_4c,MI,(uint64_t)size,(void *)address);
  if (DVar4 == MCDisassembler_Fail) {
switchD_001898bb_default:
    MCInst_clear(MI);
    uVar8 = 0;
    DVar4 = MCDisassembler_Fail;
    size = local_38;
  }
  else {
    uVar8 = 4;
    size = local_38;
  }
  goto LAB_00189a59;
}

Assistant:

bool PPC_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = getInstruction(instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}